

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapArea(Ivy_Man_t *pAig)

{
  Vec_Vec_t *vLuts;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int *piVar4;
  int i;
  int iVar5;
  int iVar6;
  
  vLuts = *(Vec_Vec_t **)((long)pAig->pData + 0x18);
  for (iVar5 = 0; iVar5 < vLuts->nSize; iVar5 = iVar5 + 1) {
    pVVar2 = Vec_VecEntry(vLuts,iVar5);
    pVVar2->nSize = 0;
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < pAig->vPos->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vPos,iVar6);
    iVar1 = Ivy_FastMapArea_rec(pAig,(Ivy_Obj_t *)
                                     (*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe),vLuts);
    iVar5 = iVar5 + iVar1;
  }
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    piVar4 = (int *)Vec_PtrEntry(pAig->vObjs,iVar6);
    if ((piVar4 != (int *)0x0) && (0xfffffffd < (piVar4[2] & 0xfU) - 7)) {
      *(undefined1 *)
       (*(long *)((long)pAig->pData + 0x10) + 1 +
       (long)*(int *)((long)pAig->pData + 8) * (long)*piVar4) = 0;
    }
  }
  return iVar5;
}

Assistant:

int Ivy_FastMapArea( Ivy_Man_t * pAig )
{
    Vec_Vec_t * vLuts;
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    // get the array to store the nodes
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    Vec_VecClear( vLuts );
    // explore starting from each node
    Ivy_ManForEachPo( pAig, pObj, i )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ObjFanin0(pObj), vLuts );
    // clean the marks
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_ObjSupp( pAig, pObj )->fMark = 0;
    return Counter;
}